

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void test_samplers(void)

{
  int iVar1;
  float y;
  float x;
  Sampler s;
  float local_98;
  float local_94;
  Sampler local_90;
  
  create_samplers(&local_90,1);
  iVar1 = 1;
  do {
    sample_unit_square(&local_90,&local_94,&local_98,(float *)0x0);
    printf("%f %f\n",(double)local_94,(double)local_98);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  return;
}

Assistant:

void test_samplers() {
    Sampler s;
    create_samplers(&s, 1);
    for (int i = 0; i < 2 * STRATIFIED_RESOLUTION * STRATIFIED_RESOLUTION; i++) {
        float x, y;
        sample_unit_square(&s, &x, &y, NULL);
        printf("%f %f\n", x, y);
    }
}